

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O1

void __thiscall S2RegionCoverer::GetInitialCandidates(S2RegionCoverer *this)

{
  int iVar1;
  pointer pSVar2;
  Candidate *candidate;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  pointer pSVar3;
  vector<S2CellId,_std::allocator<S2CellId>_> cells;
  S2RegionCoverer tmp_coverer;
  vector<S2CellId,_std::allocator<S2CellId>_> local_c8;
  S2RegionCoverer local_b0;
  S2Cell local_58;
  
  S2RegionCoverer(&local_b0);
  iVar1 = (this->options_).max_cells_;
  local_b0.options_.max_cells_ = 4;
  if (iVar1 < 4) {
    local_b0.options_.max_cells_ = iVar1;
  }
  Options::set_max_level(&local_b0.options_,(this->options_).max_level_);
  local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*this->region_->_vptr_S2Region[5])();
  CanonicalizeCovering(&local_b0,&local_c8);
  AdjustCellLevels(this,&local_c8);
  pSVar2 = local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar3 = local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      S2Cell::S2Cell(&local_58,(S2CellId)pSVar3->id_);
      candidate = NewCandidate(this,&local_58);
      AddCandidate(this,candidate);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2);
  }
  if (local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ~S2RegionCoverer(&local_b0);
  return;
}

Assistant:

void S2RegionCoverer::GetInitialCandidates() {
  // Optimization: start with a small (usually 4 cell) covering of the
  // region's bounding cap.
  S2RegionCoverer tmp_coverer;
  tmp_coverer.mutable_options()->set_max_cells(min(4, options_.max_cells()));
  tmp_coverer.mutable_options()->set_max_level(options_.max_level());
  vector<S2CellId> cells;
  tmp_coverer.GetFastCovering(*region_, &cells);
  AdjustCellLevels(&cells);
  for (S2CellId cell_id : cells) {
    AddCandidate(NewCandidate(S2Cell(cell_id)));
  }
}